

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O2

ImageFormat __thiscall
deqp::gls::fboc::details::TestBase::getDefaultFormat(TestBase *this,GLenum attPoint,GLenum bufType)

{
  _Rb_tree_header *p_Var1;
  Context *pCVar2;
  FormatFlags FVar3;
  FormatFlags FVar4;
  NotSupportedError *this_00;
  ImageFormat IVar5;
  Formats formats;
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  local_60;
  
  if (bufType == 0) {
    IVar5.format = 0;
    IVar5.unsizedType = 0;
  }
  else {
    pCVar2 = this->m_ctx;
    FVar3 = FboUtil::formatFlag(attPoint);
    FVar4 = FboUtil::formatFlag(bufType);
    FboUtil::FormatDB::getFormats(&formats,&pCVar2->m_coreFormats,FVar3 | FVar4);
    p_Var1 = &formats._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)formats._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
      pCVar2 = this->m_ctx;
      FVar3 = FboUtil::formatFlag(attPoint);
      FVar4 = FboUtil::formatFlag(bufType);
      FboUtil::FormatDB::getFormats((Formats *)&local_60,&pCVar2->m_ctxFormats,FVar4 | FVar3);
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::operator=(&formats._M_t,&local_60);
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::~_Rb_tree(&local_60);
    }
    if ((_Rb_tree_header *)formats._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Unsupported attachment kind for attachment point",
                 glcts::fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFboCompletenessTests.cpp"
                 ,0x2bf);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    IVar5.format = formats._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
    IVar5.unsizedType =
         *(GLenum *)&formats._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].field_0x4;
    std::
    _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
    ::~_Rb_tree(&formats._M_t);
  }
  return IVar5;
}

Assistant:

ImageFormat TestBase::getDefaultFormat (GLenum attPoint, GLenum bufType) const
{
	if (bufType == GL_NONE)
	{
		return ImageFormat::none();
	}

	// Prefer a standard format, if there is one, but if not, use a format
	// provided by an extension.
	Formats formats = m_ctx.getCoreFormats().getFormats(formatFlag(attPoint) |
														 formatFlag(bufType));
	Formats::const_iterator it = formats.begin();
	if (it == formats.end())
	{
		formats = m_ctx.getCtxFormats().getFormats(formatFlag(attPoint) |
													 formatFlag(bufType));
		it = formats.begin();
	}
	if (it == formats.end())
		throw tcu::NotSupportedError("Unsupported attachment kind for attachment point",
									 "", __FILE__, __LINE__);
	return *it;
}